

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_statemachine(Curl_easy *data,connectdata *conn)

{
  ushort *puVar1;
  byte *pbVar2;
  connectdata *pcVar3;
  IMAP *pIVar4;
  curl_trc_feat *pcVar5;
  ulong uVar6;
  dynbuf *s;
  _Bool _Var7;
  char cVar8;
  unsigned_short uVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  int iVar12;
  imapstate iVar13;
  char *pcVar14;
  ulong uVar15;
  size_t sVar16;
  byte *pbVar17;
  char *pcVar18;
  int imapcode;
  size_t nread;
  ulong local_88;
  connectdata *local_80;
  pingpong *local_78;
  CURLcode local_6c;
  dynbuf *local_68;
  dynbuf local_60;
  SASL *local_40;
  size_t local_38;
  
  local_78 = (pingpong *)&conn->proto;
  local_38 = 0;
  local_68 = (dynbuf *)((long)&conn->proto + 0x58);
  local_40 = &(conn->proto).imapc.sasl;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) goto LAB_0013e3b6;
LAB_0013e307:
  local_60.bufr = (char *)((ulong)local_60.bufr & 0xffffffffffffff00);
  _Var7 = Curl_conn_is_ssl(conn,0);
  if (!_Var7) {
    CVar10 = Curl_ssl_cfilter_add(data,conn,0);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    conn->handler = &Curl_handler_imaps;
  }
  CVar10 = Curl_conn_connect(data,0,false,(_Bool *)&local_60);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  if ((char)local_60.bufr == '\x01') {
    *(undefined2 *)((long)&conn->proto + 0xb8) = 0;
    *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
    *(byte *)((long)&conn->proto + 0xfb) = (*(byte *)((long)&conn->proto + 0xfb) & 0xfa) + 1;
    CVar10 = imap_sendf(data,"CAPABILITY");
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    (data->conn->proto).imapc.state = IMAP_CAPABILITY;
  }
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    return CURLE_OK;
  }
LAB_0013e3b6:
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar10 = Curl_pp_flushsend(data,local_78);
    return CVar10;
  }
  do {
    CVar11 = Curl_pp_readresp(data,0,local_78,(int *)&local_6c,&local_38);
    CVar10 = local_6c;
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
    if (local_6c == ~CURLE_OK) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_6c == CURLE_OK) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pcVar3 = data->conn;
      if (local_6c != CURLE_UNSUPPORTED_PROTOCOL) {
        if (local_6c != CURLE_URL_MALFORMAT) {
          Curl_failf(data,"Got unexpected imap-server response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        pbVar17 = (byte *)((long)&pcVar3->proto + 0xfb);
        *pbVar17 = *pbVar17 | 2;
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"PREAUTH connection, already authenticated");
        }
      }
      *(undefined2 *)((long)&pcVar3->proto + 0xb8) = 0;
      *(undefined2 *)((long)&pcVar3->proto + 0xbc) = 0;
      pbVar17 = (byte *)((long)&pcVar3->proto + 0xfb);
      *pbVar17 = *pbVar17 & 0xfb;
      CVar10 = imap_sendf(data,"CAPABILITY");
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      (data->conn->proto).imapc.state = IMAP_CAPABILITY;
      goto LAB_0013ea62;
    case IMAP_CAPABILITY:
      local_80 = data->conn;
      pcVar14 = Curl_dyn_ptr(&(local_80->proto).ftpc.pp.recvbuf);
      pcVar3 = local_80;
      if (CVar10 == CURLE_ABORTED_BY_CALLBACK) {
        pbVar17 = (byte *)(pcVar14 + 2);
LAB_0013e5b8:
        do {
          uVar15 = (ulong)*pbVar17;
          if (uVar15 < 0x21) {
            if ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0) {
              pbVar17 = pbVar17 + 1;
              goto LAB_0013e5b8;
            }
            if (uVar15 == 0) goto LAB_0013ea62;
          }
          pcVar14 = (char *)0xfffffffffffffffb;
          while ((0x20 < (byte)uVar15 || ((0x100002601U >> (uVar15 & 0x3f) & 1) == 0))) {
            pbVar2 = pbVar17 + 6 + (long)pcVar14;
            pcVar14 = pcVar14 + 1;
            uVar15 = (ulong)*pbVar2;
          }
          pcVar18 = pcVar14 + 5;
          if (pcVar18 == (char *)0x7) {
            if (*(int *)(pbVar17 + 3) != 0x52492d4c || *(int *)pbVar17 != 0x4c534153)
            goto LAB_0013e698;
            pbVar2 = (byte *)((long)&pcVar3->proto + 0xfb);
            *pbVar2 = *pbVar2 | 0x10;
            pcVar18 = (char *)0x7;
          }
          else if (pcVar18 == (char *)0xd) {
            if (*(long *)(pbVar17 + 5) != 0x44454c4241534944 ||
                *(long *)pbVar17 != 0x5349444e49474f4c) goto LAB_0013e698;
            pbVar2 = (byte *)((long)&pcVar3->proto + 0xfb);
            *pbVar2 = *pbVar2 | 8;
            pcVar18 = (char *)0xd;
          }
          else if (pcVar18 == (char *)0x8) {
            if (*(long *)pbVar17 != 0x534c545452415453) goto LAB_0013e698;
            pbVar2 = (byte *)((long)&pcVar3->proto + 0xfb);
            *pbVar2 = *pbVar2 | 4;
            pcVar18 = (char *)0x8;
          }
          else if ((char *)0x5 < pcVar18) {
LAB_0013e698:
            if (pbVar17[4] == 0x3d && *(int *)pbVar17 == 0x48545541) {
              pbVar17 = pbVar17 + 5;
              uVar9 = Curl_sasl_decode_mech((char *)pbVar17,(size_t)pcVar14,(size_t *)&local_60);
              pcVar18 = pcVar14;
              if ((uVar9 != 0) && (local_60.bufr == pcVar14)) {
                puVar1 = (ushort *)((long)&pcVar3->proto + 0xb8);
                *puVar1 = *puVar1 | uVar9;
              }
            }
          }
          pbVar17 = pbVar17 + (long)pcVar18;
        } while( true );
      }
      if (((data->set).use_ssl != '\0') && (_Var7 = Curl_conn_is_ssl(local_80,0), !_Var7)) {
        if ((CVar10 == CURLE_UNSUPPORTED_PROTOCOL) &&
           ((*(byte *)((long)&pcVar3->proto + 0xfb) & 6) == 4)) {
          CVar10 = imap_sendf(data,"STARTTLS");
          if (CVar10 != CURLE_OK) {
            return CVar10;
          }
          (data->conn->proto).imapc.state = IMAP_STARTTLS;
          goto LAB_0013ea62;
        }
        if (1 < (data->set).use_ssl) {
          pcVar14 = "STARTTLS not available.";
          goto LAB_0013ec82;
        }
      }
      CVar11 = imap_perform_authentication(data,pcVar3);
      goto LAB_0013ea59;
    case IMAP_STARTTLS:
      pcVar3 = data->conn;
      if ((pcVar3->proto).ftpc.pp.overflow != 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (local_6c == CURLE_UNSUPPORTED_PROTOCOL) {
        (pcVar3->proto).imapc.state = IMAP_UPGRADETLS;
      }
      else {
        if ((data->set).use_ssl != '\x01') {
          pcVar14 = "STARTTLS denied";
LAB_0013ec82:
          Curl_failf(data,pcVar14);
          return CURLE_USE_SSL_FAILED;
        }
        CVar10 = imap_perform_authentication(data,pcVar3);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
      }
      iVar13 = (conn->proto).imapc.state;
      if (iVar13 != IMAP_UPGRADETLS) goto LAB_0013ea69;
      goto LAB_0013e307;
    case IMAP_AUTHENTICATE:
      CVar11 = Curl_sasl_continue(local_40,data,local_6c,(saslprogress *)&local_60);
      if (CVar11 == CURLE_OK) {
        if ((int)local_60.bufr == 0) {
          if (((*(byte *)((long)&conn->proto + 0xfb) & 8) == 0) &&
             (((conn->proto).imapc.preftype & 1) != 0)) {
            CVar11 = imap_perform_login(data,conn);
          }
          else {
            Curl_failf(data,"Authentication cancelled");
            CVar11 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar11 = CURLE_OK;
          CVar10 = CURLE_OK;
          if ((int)local_60.bufr == 2) goto LAB_0013e8a4;
        }
      }
      goto LAB_0013ea59;
    case IMAP_LOGIN:
      if (local_6c != CURLE_UNSUPPORTED_PROTOCOL) {
        Curl_failf(data,"Access denied. %c",(ulong)local_6c);
        return CURLE_LOGIN_DENIED;
      }
      break;
    case IMAP_LIST:
    case IMAP_SEARCH:
      pcVar14 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      if (CVar10 == CURLE_UNSUPPORTED_PROTOCOL) break;
      if (CVar10 != CURLE_ABORTED_BY_CALLBACK) {
        return CURLE_QUOTE_ERROR;
      }
      CVar11 = Curl_client_write(data,1,pcVar14,(data->conn->proto).ftpc.pp.nfinal);
      goto LAB_0013ea59;
    case IMAP_SELECT:
      local_80 = data->conn;
      pIVar4 = (data->req).p.imap;
      pcVar14 = Curl_dyn_ptr(&(local_80->proto).ftpc.pp.recvbuf);
      pcVar3 = local_80;
      if (CVar10 == CURLE_UNSUPPORTED_PROTOCOL) {
        if (((pIVar4->uidvalidity != (char *)0x0) &&
            (pcVar14 = (local_80->proto).ftpc.server_os, pcVar14 != (char *)0x0)) &&
           (iVar12 = curl_strequal(pIVar4->uidvalidity,pcVar14), iVar12 == 0)) {
          Curl_failf(data,"Mailbox UIDVALIDITY has changed");
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
        pcVar14 = (*Curl_cstrdup)(pIVar4->mailbox);
        (pcVar3->proto).imapc.mailbox = pcVar14;
        if (pcVar14 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        if (pIVar4->custom == (char *)0x0) {
          if (pIVar4->query == (char *)0x0) {
            CVar11 = imap_perform_fetch(data);
          }
          else {
            CVar11 = imap_perform_search(data);
          }
        }
        else {
          CVar11 = imap_perform_list(data);
        }
        goto LAB_0013ea59;
      }
      if (CVar10 != CURLE_ABORTED_BY_CALLBACK) {
        Curl_failf(data,"Select failed");
        return CURLE_LOGIN_DENIED;
      }
      iVar12 = curl_strnequal(pcVar14 + 2,"OK [UIDVALIDITY ",0x10);
      if (iVar12 != 0) {
        sVar16 = 0;
        do {
          cVar8 = (pcVar14 + 0x12)[sVar16];
          if (9 < (byte)(cVar8 - 0x30U)) {
            if (sVar16 != 0) goto LAB_0013e9b3;
            goto LAB_0013ea62;
          }
          sVar16 = sVar16 + 1;
        } while (sVar16 != 0x14);
        cVar8 = pcVar14[0x26];
        sVar16 = 0x14;
LAB_0013e9b3:
        if (cVar8 == ']') {
          Curl_dyn_init(&local_60,0x14);
          CVar10 = Curl_dyn_addn(&local_60,pcVar14 + 0x12,sVar16);
          pcVar3 = local_80;
          if (CVar10 != CURLE_OK) {
            return CURLE_OUT_OF_MEMORY;
          }
          (*Curl_cfree)((local_80->proto).ftpc.server_os);
          pcVar14 = Curl_dyn_ptr(&local_60);
          (pcVar3->proto).ftpc.server_os = pcVar14;
        }
      }
      goto LAB_0013ea62;
    case IMAP_FETCH:
      pcVar14 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      local_88 = 0;
      if (CVar10 == CURLE_ABORTED_BY_CALLBACK) {
        local_60.bufr = (char *)memchr(pcVar14,0x7b,(data->conn->proto).ftpc.pp.nfinal);
        if (local_60.bufr != (char *)0x0) {
          local_60.bufr = local_60.bufr + 1;
          iVar12 = Curl_str_number(&local_60.bufr,(curl_off_t *)&local_88,0x7fffffffffffffff);
          if ((iVar12 == 0) && (iVar12 = Curl_str_single(&local_60.bufr,'}'), iVar12 == 0)) {
            if ((((data->set).field_0x89f & 0x40) != 0) &&
               ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                (0 < pcVar5->log_level)))) {
              Curl_infof(data,"Found %ld bytes to download",local_88);
            }
            Curl_pgrsSetDownloadSize(data,local_88);
            s = local_68;
            uVar15 = (conn->proto).ftpc.pp.overflow;
            if (uVar15 == 0) {
LAB_0013ebac:
              if ((data->req).bytecount != local_88) {
                (data->req).maxdownload = local_88;
                (data->state).select_bits = '\x01';
                Curl_xfer_setup1(data,1,local_88,false);
                CVar10 = CURLE_OK;
                goto LAB_0013e8a4;
              }
              Curl_xfer_setup_nop(data);
            }
            else {
              Curl_dyn_tail(local_68,uVar15);
              (conn->proto).ftpc.pp.nfinal = 0;
              if (local_88 <= uVar15) {
                uVar15 = local_88;
              }
              if (local_88 != 0) {
                pcVar14 = Curl_dyn_ptr(s);
                CVar11 = Curl_client_write(data,1,pcVar14,uVar15);
                if (CVar11 != CURLE_OK) goto LAB_0013ea59;
                if ((((data->set).field_0x89f & 0x40) != 0) &&
                   ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar5->log_level)))) {
                  Curl_infof(data,"Written %zu bytes, %lu bytes are left for transfer",uVar15);
                }
                uVar6 = (conn->proto).ftpc.pp.overflow;
                sVar16 = uVar6 - uVar15;
                if (uVar6 < uVar15 || sVar16 == 0) {
                  (conn->proto).ftpc.pp.overflow = 0;
                  Curl_dyn_reset(local_68);
                }
                else {
                  (conn->proto).ftpc.pp.overflow = sVar16;
                  Curl_dyn_tail(local_68,sVar16);
                }
                goto LAB_0013ebac;
              }
            }
            CVar10 = CURLE_OK;
            goto LAB_0013e8a4;
          }
        }
        Curl_failf(data,"Failed to parse FETCH response.");
        CVar10 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(data,-1);
        CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_0013e8a4:
      CVar11 = CVar10;
      (data->conn->proto).imapc.state = IMAP_STOP;
LAB_0013ea59:
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      goto LAB_0013ea62;
    case IMAP_FETCH_FINAL:
      if (local_6c != CURLE_UNSUPPORTED_PROTOCOL) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      break;
    case IMAP_APPEND:
      if (local_6c != CURLE_BAD_FUNCTION_ARGUMENT) {
        return CURLE_UPLOAD_FAILED;
      }
      Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      Curl_xfer_setup1(data,2,-1,false);
      break;
    case IMAP_APPEND_FINAL:
      if (local_6c != CURLE_UNSUPPORTED_PROTOCOL) {
        return CURLE_UPLOAD_FAILED;
      }
    }
    (data->conn->proto).imapc.state = IMAP_STOP;
LAB_0013ea62:
    iVar13 = (conn->proto).imapc.state;
LAB_0013ea69:
    if (iVar13 == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var7 = Curl_pp_moredata(local_78);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
upgrade_tls:
  if(imapc->state == IMAP_UPGRADETLS) {
    result = imap_perform_upgrade_tls(data, conn);
    if(result || (imapc->state == IMAP_UPGRADETLS))
      return result;
  }

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(data, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(data, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(data, imapcode, imapc->state);
      /* During UPGRADETLS, leave the read loop as we need to connect
       * (e.g. TLS handshake) before we continue sending/receiving. */
      if(!result && (imapc->state == IMAP_UPGRADETLS))
        goto upgrade_tls;
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(data, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(data, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
    default:
      /* internal error */
      imap_state(data, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}